

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallbuddyrange.h
# Opt level: O0

void snmalloc::
     BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
     ::set(Handle ptr,Contents r)

{
  Handle ptr_local;
  Contents r_local;
  
  if (r.unsafe_capptr ==
      (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
       *)0x0) {
    *ptr.val = *ptr.val & 1;
  }
  else {
    *ptr.val = (long)&((r.unsafe_capptr)->left).unsafe_capptr + (*ptr.val & 1);
  }
  return;
}

Assistant:

static void set(Handle ptr, Contents r)
    {
      SNMALLOC_ASSERT((address_cast(r) & MASK) == 0);
      if (r == nullptr)
        *ptr = CapPtr<FreeChunk<bounds>, bounds>::unsafe_from(
          reinterpret_cast<FreeChunk<bounds>*>((*ptr).unsafe_uintptr() & MASK));
      else
        // Preserve lower bit.
        *ptr = pointer_offset(r, (address_cast(*ptr) & MASK))
                 .template as_static<FreeChunk<bounds>>();
    }